

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

CURLcode socket_open(Curl_easy *data,Curl_sockaddr_ex *addr,curl_socket_t *sockfd)

{
  uint uVar1;
  curl_socket_t cVar2;
  int iVar3;
  CURLcode CVar4;
  
  if ((data->set).fopensocket == (curl_opensocket_callback)0x0) {
    iVar3 = socket(addr->family,addr->socktype,addr->protocol);
    *sockfd = iVar3;
  }
  else {
    Curl_set_in_callback(data,true);
    cVar2 = (*(data->set).fopensocket)
                      ((data->set).opensocket_client,CURLSOCKTYPE_IPCXN,(curl_sockaddr *)addr);
    *sockfd = cVar2;
    Curl_set_in_callback(data,false);
  }
  if (*sockfd == -1) {
    CVar4 = CURLE_COULDNT_CONNECT;
  }
  else {
    uVar1 = data->conn->scope_id;
    CVar4 = CURLE_OK;
    if ((uVar1 != 0) && (CVar4 = CURLE_OK, addr->family == 10)) {
      *(uint *)((long)&addr->_sa_ex_u + 0x18) = uVar1;
      CVar4 = CURLE_OK;
    }
  }
  return CVar4;
}

Assistant:

static CURLcode socket_open(struct Curl_easy *data,
                            struct Curl_sockaddr_ex *addr,
                            curl_socket_t *sockfd)
{
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  if(data->set.fopensocket) {
   /*
    * If the opensocket callback is set, all the destination address
    * information is passed to the callback. Depending on this information the
    * callback may opt to abort the connection, this is indicated returning
    * CURL_SOCKET_BAD; otherwise it will return a not-connected socket. When
    * the callback returns a valid socket the destination address information
    * might have been changed and this 'new' address will actually be used
    * here to connect.
    */
    Curl_set_in_callback(data, TRUE);
    *sockfd = data->set.fopensocket(data->set.opensocket_client,
                                    CURLSOCKTYPE_IPCXN,
                                    (struct curl_sockaddr *)addr);
    Curl_set_in_callback(data, FALSE);
  }
  else {
    /* opensocket callback not set, so simply create the socket now */
    *sockfd = socket(addr->family, addr->socktype, addr->protocol);
  }

  if(*sockfd == CURL_SOCKET_BAD)
    /* no socket, no connection */
    return CURLE_COULDNT_CONNECT;

#if defined(USE_IPV6) && defined(HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID)
  if(data->conn->scope_id && (addr->family == AF_INET6)) {
    struct sockaddr_in6 * const sa6 = (void *)&addr->curl_sa_addr;
    sa6->sin6_scope_id = data->conn->scope_id;
  }
#endif
  return CURLE_OK;
}